

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy16_s.c
# Opt level: O2

errno_t memcpy16_s(uint16_t *dest,rsize_t dmax,uint16_t *src,rsize_t smax)

{
  long lVar1;
  errno_t error;
  errno_t eVar2;
  uint32_t len;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (uint16_t *)0x0) {
    msg = "memcpy16_s: dest is NULL";
LAB_00102576:
    eVar2 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    msg = "memcpy16_s: dmax is 0";
LAB_001025c1:
    eVar2 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x8000001) {
      len = (uint32_t)dmax;
      if (smax == 0) {
        mem_prim_set16(dest,len,0);
        msg = "memcpy16_s: smax is 0";
        goto LAB_001025c1;
      }
      if (smax <= dmax) {
        if (src == (uint16_t *)0x0) {
          mem_prim_set16(dest,len,0);
          msg = "memcpy16_s: src is NULL";
          goto LAB_00102576;
        }
        if ((dest <= src || src + smax <= dest) && (dest + dmax <= src || src <= dest)) {
          mem_prim_move16(dest,src,(uint32_t)smax);
          eVar2 = 0;
          goto LAB_001025d2;
        }
        mem_prim_set16(dest,len,0);
        msg = "memcpy16_s: overlap undefined";
        eVar2 = 0x194;
        error = 0x194;
        goto LAB_001025cd;
      }
      mem_prim_set16(dest,len,0);
      msg = "memcpy16_s: smax exceeds dmax";
    }
    else {
      msg = "memcpy16_s: dmax exceeds max";
    }
    eVar2 = 0x193;
    error = 0x193;
  }
LAB_001025cd:
  invoke_safe_mem_constraint_handler(msg,(void *)0x0,error);
LAB_001025d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar2;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcpy16_s (uint16_t *dest, rsize_t dmax, const uint16_t *src, rsize_t smax)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memcpy16_s: dest is NULL",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcpy16_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM16) {
        invoke_safe_mem_constraint_handler("memcpy16_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        mem_prim_set16(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy16_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
        mem_prim_set16(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy16_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (src == NULL) {
        mem_prim_set16(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy16_s: src is NULL",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    /*
     * overlap is undefined behavior, do not allow
     */
    if( ((dest > src) && (dest < (src+smax))) ||
        ((src > dest) && (src < (dest+dmax))) ) {
        mem_prim_set16(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy16_s: overlap undefined",
                   NULL, ESOVRLP);
        return (RCNEGATE(ESOVRLP));
    }

    /*
     * now perform the copy
     */
    mem_prim_move16(dest, src, smax);

    return (RCNEGATE(EOK));
}